

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::matrixMetric(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *__return_storage_ptr__,
              SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int type)

{
  bool bVar1;
  byte bVar2;
  fpclass_type fVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  uint *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  long lVar15;
  byte bVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  fpclass_type local_258;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  uint local_1d8 [3];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  undefined8 local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  uint local_158 [3];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  undefined8 local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [13];
  undefined3 uStack_cb;
  int iStack_c8;
  bool bStack_c4;
  undefined8 local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [13];
  undefined3 uStack_4b;
  int iStack_48;
  bool bStack_44;
  undefined8 local_40;
  
  bVar16 = 0;
  local_40._0_4_ = cpp_dec_float_finite;
  local_40._4_4_ = 0x1c;
  local_b8._0_16_ = (undefined1  [16])0x0;
  local_b8._16_16_ = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = SUB1613((undefined1  [16])0x0,0);
  uStack_4b = 0;
  iStack_48 = 0;
  bStack_44 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_b8,0.0);
  iVar8 = (*(this->
            super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SLinSolver[4])(this);
  if (iVar8 == 0) {
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
    (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
    pcVar11 = &__return_storage_ptr__->m_backend;
    (pcVar11->data)._M_elems[4] = 0;
    (pcVar11->data)._M_elems[5] = 0;
    (pcVar11->data)._M_elems[6] = 0;
    (pcVar11->data)._M_elems[7] = 0;
    pcVar11 = &__return_storage_ptr__->m_backend;
    (pcVar11->data)._M_elems[8] = 0;
    (pcVar11->data)._M_elems[9] = 0;
    (pcVar11->data)._M_elems[10] = 0;
    (pcVar11->data)._M_elems[0xb] = 0;
    pcVar11 = &__return_storage_ptr__->m_backend;
    (pcVar11->data)._M_elems[0xc] = 0;
    (pcVar11->data)._M_elems[0xd] = 0;
    (pcVar11->data)._M_elems[0xe] = 0;
    (pcVar11->data)._M_elems[0xf] = 0;
    pcVar11 = &__return_storage_ptr__->m_backend;
    (pcVar11->data)._M_elems[0x10] = 0;
    (pcVar11->data)._M_elems[0x11] = 0;
    (pcVar11->data)._M_elems[0x12] = 0;
    (pcVar11->data)._M_elems[0x13] = 0;
    pcVar11 = &__return_storage_ptr__->m_backend;
    (pcVar11->data)._M_elems[0x14] = 0;
    (pcVar11->data)._M_elems[0x15] = 0;
    (pcVar11->data)._M_elems[0x16] = 0;
    (pcVar11->data)._M_elems[0x17] = 0;
    pcVar11 = &__return_storage_ptr__->m_backend;
    (pcVar11->data)._M_elems[0x18] = 0;
    (pcVar11->data)._M_elems[0x19] = 0;
    (pcVar11->data)._M_elems[0x1a] = 0;
    (pcVar11->data)._M_elems[0x1b] = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,1.0);
  }
  else {
    if (type == 2) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_b8,1.0);
      iVar8 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (0 < iVar8) {
        lVar10 = 0;
        lVar15 = 0;
        do {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_b8,
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)(((this->
                              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).diag.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar10));
          lVar15 = lVar15 + 1;
          iVar8 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar10 = lVar10 + 0x80;
        } while (lVar15 < iVar8);
      }
      local_1c0._0_4_ = cpp_dec_float_finite;
      local_1c0._4_4_ = 0x1c;
      local_238 = ZEXT816(0);
      local_228 = ZEXT816(0);
      local_218 = ZEXT816(0);
      local_208 = ZEXT816(0);
      local_1f8 = ZEXT816(0);
      local_1e8 = ZEXT816(0);
      local_1d8[0] = 0;
      local_1d8[1] = 0;
      stack0xfffffffffffffe30 = 0;
      uStack_1cb = 0;
      iStack_1c8 = 0;
      bStack_1c4 = false;
      local_140._0_4_ = cpp_dec_float_finite;
      local_140._4_4_ = 0x1c;
      local_1b8 = ZEXT816(0);
      local_1a8 = ZEXT816(0);
      local_198 = ZEXT816(0);
      local_188 = ZEXT816(0);
      local_178 = ZEXT816(0);
      local_168 = ZEXT816(0);
      local_158[0] = 0;
      local_158[1] = 0;
      stack0xfffffffffffffeb0 = 0;
      uStack_14b = 0;
      iStack_148 = 0;
      bStack_144 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_1b8,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)local_238,
                 (cpp_dec_float<200U,_int,_void> *)local_1b8,
                 (cpp_dec_float<200U,_int,_void> *)local_b8);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_238;
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_b8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar13->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar16 * -8 + 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar16 * -8 + 4);
      }
      iStack_48 = iStack_1c8;
      bStack_44 = bStack_1c4;
      local_40._0_4_ = (fpclass_type)local_1c0;
      local_40._4_4_ = local_1c0._4_4_;
    }
    else if (type == 1) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_b8,0.0);
      iVar8 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (0 < iVar8) {
        lVar15 = 0;
        lVar10 = 0;
        do {
          pnVar4 = (this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).diag.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_1c0._0_4_ = cpp_dec_float_finite;
          local_1c0._4_4_ = 0x1c;
          local_238 = (undefined1  [16])0x0;
          local_228 = (undefined1  [16])0x0;
          local_218 = (undefined1  [16])0x0;
          local_208 = (undefined1  [16])0x0;
          local_1f8 = (undefined1  [16])0x0;
          local_1e8 = (undefined1  [16])0x0;
          local_1d8[0] = 0;
          local_1d8[1] = 0;
          stack0xfffffffffffffe30 = 0;
          uStack_1cb = 0;
          iStack_1c8 = 0;
          bStack_1c4 = false;
          local_140._0_4_ = cpp_dec_float_finite;
          local_140._4_4_ = 0x1c;
          local_1b8 = (undefined1  [16])0x0;
          local_1a8 = (undefined1  [16])0x0;
          local_198 = (undefined1  [16])0x0;
          local_188 = (undefined1  [16])0x0;
          local_178 = (undefined1  [16])0x0;
          local_168 = (undefined1  [16])0x0;
          local_158[0] = 0;
          local_158[1] = 0;
          stack0xfffffffffffffeb0 = 0;
          uStack_14b = 0;
          iStack_148 = 0;
          bStack_144 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_1b8,1.0);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)local_238,
                     (cpp_dec_float<200U,_int,_void> *)local_1b8,
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)(pnVar4->m_backend).data._M_elems + lVar15));
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_b8,
                     (cpp_dec_float<200U,_int,_void> *)local_238);
          lVar10 = lVar10 + 1;
          iVar8 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar15 = lVar15 + 0x80;
        } while (lVar10 < iVar8);
      }
    }
    else if (type == 0) {
      pnVar4 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).diag.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar8 = (pnVar4->m_backend).exp;
      bVar1 = (pnVar4->m_backend).neg;
      fVar3 = (pnVar4->m_backend).fpclass;
      uVar6._0_4_ = (pnVar4->m_backend).fpclass;
      uVar6._4_4_ = (pnVar4->m_backend).prec_elem;
      uVar5._0_4_ = (pnVar4->m_backend).fpclass;
      uVar5._4_4_ = (pnVar4->m_backend).prec_elem;
      memmove(local_1b8,pnVar4,0x70);
      bStack_144 = bVar1;
      if ((bVar1 == true) && (local_1b8._0_4_ != 0 || fVar3 != cpp_dec_float_finite)) {
        bStack_144 = false;
      }
      iStack_148 = iVar8;
      local_140 = uVar5;
      memmove(local_238,pnVar4,0x70);
      bStack_1c4 = bVar1;
      if ((bVar1 != false) && (fVar3 != cpp_dec_float_finite || local_238._0_4_ != 0)) {
        bStack_1c4 = (bool)(bVar1 ^ 1);
      }
      iStack_1c8 = iVar8;
      local_1c0 = uVar6;
      iVar8 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (1 < iVar8) {
        lVar10 = 1;
        lVar15 = 0xf8;
        do {
          puVar7 = (undefined8 *)
                   ((long)(((this->
                            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).diag.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar15);
          iVar8 = *(int *)(puVar7 + -1);
          bVar2 = *(byte *)((long)puVar7 + -4);
          uVar5 = *puVar7;
          memmove((cpp_dec_float<200U,_int,_void> *)local_138,puVar7 + -0xf,0x70);
          local_258 = (fpclass_type)uVar5;
          bStack_c4 = (bool)bVar2;
          if ((bVar2 == 1) && (local_258 != cpp_dec_float_finite || local_138._0_4_ != 0)) {
            bStack_c4 = false;
          }
          iStack_c8 = iVar8;
          local_c0 = uVar5;
          if (local_258 == cpp_dec_float_NaN) {
LAB_00526969:
            if (((local_258 != cpp_dec_float_NaN) && ((fpclass_type)local_1c0 != cpp_dec_float_NaN))
               && (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_138,
                                      (cpp_dec_float<200U,_int,_void> *)local_238), 0 < iVar8)) {
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_138;
              puVar12 = (uint *)local_238;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                *puVar12 = (pcVar11->data)._M_elems[0];
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar16 * -8 + 4)
                ;
                puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
              }
              iStack_1c8 = iStack_c8;
              bStack_1c4 = bStack_c4;
              local_1c0._0_4_ = (fpclass_type)local_c0;
              puVar7 = &local_1c0;
              goto LAB_005269ca;
            }
          }
          else {
            if ((fpclass_type)local_140 == cpp_dec_float_NaN) goto LAB_00526969;
            iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_138,
                               (cpp_dec_float<200U,_int,_void> *)local_1b8);
            fVar3 = (fpclass_type)local_c0;
            local_258 = (fpclass_type)local_c0;
            if (-1 < iVar8) goto LAB_00526969;
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_138;
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pcVar13->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar16 * -8 + 4);
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar16 * -8 + 4);
            }
            iStack_148 = iStack_c8;
            bStack_144 = bStack_c4;
            local_140._0_4_ = fVar3;
            puVar7 = &local_140;
LAB_005269ca:
            *(int32_t *)((long)puVar7 + 4) = local_c0._4_4_;
          }
          lVar10 = lVar10 + 1;
          iVar8 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar15 = lVar15 + 0x80;
        } while (lVar10 < iVar8);
      }
      local_c0._0_4_ = cpp_dec_float_finite;
      local_c0._4_4_ = 0x1c;
      local_138 = (undefined1  [16])0x0;
      local_128 = (undefined1  [16])0x0;
      local_118 = (undefined1  [16])0x0;
      local_108 = (undefined1  [16])0x0;
      local_f8 = (undefined1  [16])0x0;
      local_e8 = (undefined1  [16])0x0;
      local_d8 = SUB1613((undefined1  [16])0x0,0);
      uStack_cb = 0;
      iStack_c8 = 0;
      bStack_c4 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)local_138,
                 (cpp_dec_float<200U,_int,_void> *)local_238,
                 (cpp_dec_float<200U,_int,_void> *)local_1b8);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_138;
      puVar12 = (uint *)local_b8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar12 = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar16 * -8 + 4);
        puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
      }
      iStack_48 = iStack_c8;
      bStack_44 = bStack_c4;
      local_40._0_4_ = (fpclass_type)local_c0;
      local_40._4_4_ = local_c0._4_4_;
    }
    puVar12 = (uint *)local_b8;
    pnVar14 = __return_storage_ptr__;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar14->m_backend).data._M_elems[0] = *puVar12;
      puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar16 * -2 + 1) * 4);
    }
    (__return_storage_ptr__->m_backend).exp = iStack_48;
    (__return_storage_ptr__->m_backend).neg = bStack_44;
    (__return_storage_ptr__->m_backend).fpclass = (fpclass_type)local_40;
    (__return_storage_ptr__->m_backend).prec_elem = local_40._4_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

R SLUFactor<R>::matrixMetric(int type) const
{
   R result = 0.0;

   // catch corner case of empty matrix
   if(dim() == 0)
      return 1.0;

   switch(type)
   {
   // compute condition estimate by ratio of max/min of elements on the diagonal
   case 0:
   {
      R mindiag = spxAbs(this->diag[0]);
      R maxdiag = spxAbs(this->diag[0]);

      for(int i = 1; i < dim(); ++i)
      {
         R absdiag = spxAbs(this->diag[i]);

         if(absdiag < mindiag)
            mindiag = absdiag;
         else if(absdiag > maxdiag)
            maxdiag = absdiag;
      }

      result = maxdiag / mindiag;
      break;
   }

   // compute sum of inverses of all elements on the diagonal
   case 1:
      result = 0.0;

      for(int i = 0; i < dim(); ++i)
         result += 1.0 / this->diag[i];

      break;

   // compute determinant (product of all diagonal elements of U)
   case 2:
      result = 1.0;

      for(int i = 0; i < dim(); ++i)
         result *= this->diag[i];

      result = 1.0 / result;
      break;
   }

   return result;
}